

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

unsigned_long_long get_big_unsigned(FMFieldPtr field,void *data)

{
  ushort uVar1;
  uint uVar2;
  unsigned_long_long uVar3;
  size_t sVar4;
  void *in_RDX;
  bool bVar5;
  longdouble in_ST0;
  unsigned_long tmp;
  
  switch(field->data_type) {
  case integer_type:
    uVar3 = get_big_int(field,data);
    return uVar3;
  case unsigned_type:
  case enumeration_type:
  case boolean_type:
    break;
  case float_type:
    get_big_float((longdouble *)field,(FMFieldPtr)data,in_RDX);
    return (long)in_ST0;
  default:
    fwrite("Get IOulong failed on invalid data type!\n",0x29,1,_stderr);
    exit(1);
  }
  switch(field->size) {
  case 1:
    uVar3 = (unsigned_long_long)*(byte *)((long)data + field->offset);
    break;
  case 2:
    uVar1 = *(ushort *)((long)data + field->offset);
    tmp = CONCAT62(tmp._2_6_,uVar1);
    if (field->byte_swap != '\0') {
      byte_swap((char *)&tmp,2);
      uVar1 = (ushort)tmp;
    }
    uVar3 = (unsigned_long_long)uVar1;
    break;
  case 4:
    uVar2 = *(uint *)((long)data + field->offset);
    tmp = CONCAT44(tmp._4_4_,uVar2);
    if (field->byte_swap != '\0') {
      byte_swap((char *)&tmp,4);
      uVar2 = (uint)tmp;
    }
    uVar3 = (unsigned_long_long)uVar2;
    break;
  case 8:
    uVar3 = *(unsigned_long_long *)((long)data + field->offset);
    bVar5 = field->byte_swap == '\0';
joined_r0x0011f240:
    if (!bVar5) {
      tmp = uVar3;
      byte_swap((char *)&tmp,8);
      uVar3 = tmp;
    }
    break;
  default:
    if (field->size == 0x10) {
      bVar5 = field->byte_swap == '\0';
      sVar4 = field->offset + 8;
      if (bVar5) {
        sVar4 = field->offset;
      }
      uVar3 = *(unsigned_long_long *)((long)data + sVar4);
      goto joined_r0x0011f240;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    if (get_long_warn == 0) {
      uVar3 = 0;
      fprintf(_stderr,"Get Long failed!  Size problems.  File int size is %d.\n");
      get_long_warn = get_long_warn + 1;
    }
    else {
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

static MAX_UNSIGNED_TYPE
get_big_unsigned(FMFieldPtr field, void *data)
{
    if ((field->data_type == unsigned_type) || 
	(field->data_type == enumeration_type) || 
	(field->data_type == boolean_type)) {
	if (field->size == sizeof(char)) {
	    unsigned char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(short)) {
	    unsigned short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(short));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(int)) {
	    unsigned int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(int));
	    return (MAX_UNSIGNED_TYPE) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    unsigned long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return 0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_UNSIGNED_TYPE) (long) (double) tmp;
#else
	return (MAX_UNSIGNED_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOulong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}